

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::ClipDistance::NegativeTest::iterate(NegativeTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  bool local_29;
  bool may_be_ok;
  bool is_ok;
  Functions *gl;
  NegativeTest *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  bVar1 = testClipVertexBuildingErrors(this,gl_00);
  local_29 = false;
  if (bVar1) {
    local_29 = testMaxClipDistancesBuildingErrors(this,gl_00);
  }
  bVar1 = testClipDistancesRedeclarationBuildingErrors(this,gl_00);
  if (local_29 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_QUALITY_WARNING,"Pass with warning");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::NegativeTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Iterate tests */
	bool is_ok	 = true;
	bool may_be_ok = true;

	is_ok	 = is_ok && testClipVertexBuildingErrors(gl);
	is_ok	 = is_ok && testMaxClipDistancesBuildingErrors(gl);
	may_be_ok = may_be_ok && testClipDistancesRedeclarationBuildingErrors(gl);

	/* Result's setup. */
	if (is_ok)
	{
		if (may_be_ok)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Pass with warning");
		}
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}